

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDFaceParameter * __thiscall
ON_SubDMeshFragment::VertexSubDFaceParameter
          (ON_SubDFaceParameter *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid2dex_i,
          uint grid2dex_j)

{
  byte bVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  ushort uVar8;
  ON_SubDFaceCornerDex cdex;
  ON_3dPoint debugP;
  
  VertexPoint(&debugP,this,grid2dex_i,grid2dex_j);
  bVar6 = ON_3dPoint::IsValid(&debugP);
  if (((bVar6) && (bVar1 = (this->m_grid).m_side_segment_count, bVar1 != 0)) &&
     (uVar7 = (uint)bVar1, grid2dex_j <= uVar7 && grid2dex_i <= uVar7)) {
    uVar3 = this->m_face_fragment_count;
    uVar8 = 4;
    if (uVar3 != 1) {
      uVar8 = uVar3;
    }
    if (2 < uVar8) {
      uVar2 = this->m_face_fragment_index;
      if (uVar8 == 4) {
        if (uVar2 != 0) goto LAB_00609b87;
        ON_SubDFaceParameter::CreateFromQuadFaceParameteters
                  (__return_storage_ptr__,(double)(int)grid2dex_i * (1.0 / (double)uVar7),
                   (double)(int)grid2dex_j * (1.0 / (double)uVar7));
      }
      else {
        if (uVar8 <= uVar2) goto LAB_00609b87;
        ON_SubDFaceCornerDex::ON_SubDFaceCornerDex(&cdex,(uint)uVar2,(uint)uVar8);
        ON_SubDFaceParameter::ON_SubDFaceParameter
                  (__return_storage_ptr__,cdex,
                   (double)(int)grid2dex_i * (-0.5 / (double)uVar7) + 0.5,
                   (double)(int)grid2dex_j * (-0.5 / (double)uVar7) + 0.5);
      }
      bVar6 = ON_SubDFaceParameter::IsNotSet(__return_storage_ptr__);
      if (!bVar6) {
        return __return_storage_ptr__;
      }
    }
  }
LAB_00609b87:
  __return_storage_ptr__->m_t = ON_SubDFaceParameter::Nan.m_t;
  dVar5 = ON_SubDFaceParameter::Nan.m_s;
  uVar4 = ON_SubDFaceParameter::Nan._4_4_;
  __return_storage_ptr__->m_cdex = ON_SubDFaceParameter::Nan.m_cdex;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar4;
  __return_storage_ptr__->m_s = dVar5;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDFaceParameter ON_SubDMeshFragment::VertexSubDFaceParameter(
  unsigned grid2dex_i,
  unsigned grid2dex_j
) const
{
  for (;;)
  {
    const ON_3dPoint debugP = VertexPoint(grid2dex_i, grid2dex_j);
    if (false == debugP.IsValid())
      break;


    const unsigned gc = m_grid.SideSegmentCount();
    if (gc < 1)
      break;
    if (grid2dex_i > gc || grid2dex_j > gc)
      break;

    // quad faces have m_face_fragment_count = 1;
    // n-gon faces have m_face_fragment_count = n (n = 3 or n >= 5)
    const unsigned face_edge_count 
      = (1 == m_face_fragment_count) 
      ? 4u
      : ((unsigned)m_face_fragment_count);

    if (face_edge_count < 3)
      break;

    if (4 == face_edge_count)
    {
      // quad face
      if (0 != m_face_fragment_index)
        break;
      // quad parameters run from 0.0 to 1.0.
      const double gdelta = 1.0 / ((double)gc);
      const double quad_s = gdelta * grid2dex_i;
      const double quad_t = gdelta * grid2dex_j;
      const ON_SubDFaceParameter p = ON_SubDFaceParameter::CreateFromQuadFaceParameteters(quad_s, quad_t);
      if (p.IsNotSet())
        break;
      return p;
    }

    // ngon face
    if (0 != m_face_fragment_index >= face_edge_count)
      break;
    // corner parameters run from 0.0 to 0.5.
    const double gdelta = 0.5 / ((double)gc);
    const double corner_s = 0.5 - gdelta * grid2dex_i;
    const double corner_t = 0.5 - gdelta * grid2dex_j;
    const ON_SubDFaceCornerDex cdex(m_face_fragment_index, face_edge_count);
    const ON_SubDFaceParameter p(cdex, corner_s, corner_t);
    if (p.IsNotSet())
      break;
    return p;
  }

  return ON_SubDFaceParameter::Nan;
}